

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree * absl::cord_internal::CordRepBtree::Rebuild(CordRepBtree *tree)

{
  CordRepBtree *pCVar1;
  CordRepBtree *parent;
  CordRepBtree **__end2;
  CordRepBtree **__begin2;
  CordRepBtree *(*__range2) [13];
  CordRepBtree *stack [13];
  CordRepBtree *local_18;
  CordRepBtree *node;
  CordRepBtree *tree_local;
  
  local_18 = New(0);
  memset(&__range2,0,0x68);
  __range2 = (CordRepBtree *(*) [13])local_18;
  Rebuild((CordRepBtree **)&__range2,tree,true);
  __end2 = (CordRepBtree **)&__range2;
  while( true ) {
    if (__end2 == stack + 0xc) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x48a,
                    "static CordRepBtree *absl::cord_internal::CordRepBtree::Rebuild(CordRepBtree *)"
                   );
    }
    pCVar1 = *__end2;
    if (pCVar1 == (CordRepBtree *)0x0) break;
    __end2 = __end2 + 1;
    local_18 = pCVar1;
  }
  return local_18;
}

Assistant:

CordRepBtree* CordRepBtree::Rebuild(CordRepBtree* tree) {
  // Set up initial stack with empty leaf node.
  CordRepBtree* node = CordRepBtree::New();
  CordRepBtree* stack[CordRepBtree::kMaxDepth + 1] = {node};

  // Recursively build the tree, consuming the input tree.
  Rebuild(stack, tree, /* consume reference */ true);

  // Return top most node
  for (CordRepBtree* parent : stack) {
    if (parent == nullptr) return node;
    node = parent;
  }

  // Unreachable
  assert(false);
  return nullptr;
}